

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

double __thiscall Tokenizer::readInteger(Tokenizer *this)

{
  char *__nptr;
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  byte bVar4;
  double dVar5;
  char c;
  string str;
  char local_59;
  char *local_50;
  undefined8 local_48;
  char local_40;
  undefined7 uStack_3f;
  char *local_30;
  
  local_48 = 0;
  local_40 = '\0';
  bVar4 = 0;
  local_50 = &local_40;
  do {
    iVar1 = std::istream::peek();
    if ((bool)(iVar1 != 0x2e | bVar4)) {
      iVar1 = std::istream::peek();
      __nptr = local_50;
      if (9 < iVar1 - 0x30U) break;
    }
    std::istream::get((char *)this->inStream);
    bVar4 = bVar4 | local_59 == '.';
    std::__cxx11::string::push_back((char)&local_50);
  } while( true );
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  dVar5 = strtod(__nptr,&local_30);
  if (local_30 == __nptr) {
    uVar3 = std::__throw_invalid_argument("stod");
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    _Unwind_Resume(uVar3);
  }
  if (*piVar2 != 0) {
    if (*piVar2 != 0x22) goto LAB_0011290b;
    dVar5 = (double)std::__throw_out_of_range("stod");
  }
  *piVar2 = iVar1;
LAB_0011290b:
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return dVar5;
}

Assistant:

double Tokenizer::readInteger() {
    // This function is called when it is known that
    // the first character in input is a digit.
    // The function reads and returns all remaining digits.

    double doubleStr = 0;
    std::string str;
    char c;
    bool decimal = false;
    while( ((inStream.peek() == '.') && !decimal) || isdigit(inStream.peek())) {
        inStream.get(c);
        if(c == '.')
            decimal = true;
        str += c;
    }
    doubleStr = std::stod(str);
    return doubleStr;
}